

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_polynomial_model.hpp
# Opt level: O2

Polynomial<unsigned_int,_double> * __thiscall
cimod::BinaryPolynomialModel<unsigned_int,_double>::ToHubo
          (Polynomial<unsigned_int,_double> *__return_storage_ptr__,
          BinaryPolynomialModel<unsigned_int,_double> *this)

{
  double dVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer pvVar4;
  long lVar5;
  long lVar6;
  mapped_type *pmVar7;
  size_t num_of_key;
  long lVar8;
  long lVar9;
  long lVar10;
  size_t val;
  size_t sVar11;
  size_t val_1;
  bool bVar12;
  double dVar13;
  undefined1 auVar14 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> changed_key;
  
  if (this->vartype_ == BINARY) {
    GetPolynomial(__return_storage_ptr__,this);
  }
  else {
    (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
    (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
    (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (__return_storage_ptr__->_M_h)._M_element_count = 0;
    (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
    (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
    (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
    pvVar2 = (this->poly_key_list_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pvVar3 = (this->poly_key_list_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (lVar9 = 0; lVar9 != ((long)pvVar2 - (long)pvVar3) / 0x18; lVar9 = lVar9 + 1) {
      pvVar4 = (this->poly_key_list_).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      dVar1 = (this->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar9];
      lVar8 = (long)*(pointer *)
                     ((long)&pvVar4[lVar9].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data + 8) -
              *(long *)&pvVar4[lVar9].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data >> 2;
      sVar11 = 1;
      lVar5 = lVar8;
      while (bVar12 = lVar5 != 0, lVar5 = lVar5 + -1, bVar12) {
        sVar11 = sVar11 * 2;
      }
      for (num_of_key = 0; num_of_key != sVar11; num_of_key = num_of_key + 1) {
        GenerateChangedKey(&changed_key,this,pvVar4 + lVar9,num_of_key);
        lVar10 = (long)changed_key.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)changed_key.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2;
        lVar5 = 1;
        lVar6 = lVar10;
        while (bVar12 = lVar6 != 0, lVar6 = lVar6 + -1, bVar12) {
          lVar5 = lVar5 * 2;
        }
        pmVar7 = std::__detail::
                 _Map_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)__return_storage_ptr__,&changed_key);
        auVar14._8_4_ = (int)((ulong)lVar5 >> 0x20);
        auVar14._0_8_ = lVar5;
        auVar14._12_4_ = 0x45300000;
        dVar13 = ((auVar14._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) * dVar1;
        if (((int)lVar8 - (int)lVar10 & 1U) != 0) {
          dVar13 = -dVar13;
        }
        *pmVar7 = dVar13 + *pmVar7;
        pmVar7 = std::__detail::
                 _Map_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)__return_storage_ptr__,&changed_key);
        if ((*pmVar7 == 0.0) && (!NAN(*pmVar7))) {
          std::
          _Hashtable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::_M_erase(&__return_storage_ptr__->_M_h,&changed_key);
        }
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&changed_key.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Polynomial<IndexType, FloatType> ToHubo() const {
      if ( vartype_ == Vartype::BINARY ) {
        return GetPolynomial();
      }
      Polynomial<IndexType, FloatType> poly_map;
      std::size_t num_interactions = GetNumInteractions();
      for ( std::size_t i = 0; i < num_interactions; ++i ) {
        const std::vector<IndexType> &original_key = poly_key_list_[ i ];
        const FloatType original_value = poly_value_list_[ i ];
        const std::size_t original_key_size = original_key.size();
        const std::size_t changed_key_list_size = IntegerPower( 2, original_key_size );

        for ( std::size_t j = 0; j < changed_key_list_size; ++j ) {
          const auto changed_key = GenerateChangedKey( original_key, j );
          int sign = ( ( original_key_size - changed_key.size() ) % 2 == 0 ) ? 1.0 : -1.0;
          FloatType changed_value = original_value * IntegerPower( 2, changed_key.size() ) * sign;
          poly_map[ changed_key ] += changed_value;
          if ( poly_map[ changed_key ] == 0.0 ) {
            poly_map.erase( changed_key );
          }
        }
      }
      return poly_map;
    }